

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_queue.c
# Opt level: O0

int pthread_queue_dequeue(pthread_queue_t *queue,void *buf,uint32_t timeout)

{
  int iVar1;
  int in_EDX;
  void *in_RSI;
  long *in_RDI;
  timespec *pts;
  timespec ts;
  int ret;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  pthread_queue_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    csp_print_func("csp not initialized\n");
    local_4 = -1;
  }
  else if ((in_EDX == -1) ||
          (iVar1 = get_deadline((timespec *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4),
          iVar1 == 0)) {
    pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 4));
    local_4 = wait_item_available(in_stack_ffffffffffffffd8,
                                  (timespec *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (local_4 == 0) {
      memcpy(in_RSI,(void *)(*in_RDI + (long)((int)in_RDI[3] * *(int *)((long)in_RDI + 0xc))),
             (long)*(int *)((long)in_RDI + 0xc));
      *(int *)(in_RDI + 2) = (int)in_RDI[2] + -1;
      *(int *)(in_RDI + 3) = ((int)in_RDI[3] + 1) % (int)in_RDI[1];
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 4));
    if (local_4 == 0) {
      pthread_cond_broadcast((pthread_cond_t *)(in_RDI + 9));
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int pthread_queue_dequeue(pthread_queue_t * queue, void * buf, uint32_t timeout) {

	int ret;
	struct timespec ts;
	struct timespec * pts;

	if(!queue){
		csp_print("csp not initialized\n");
		return PTHREAD_QUEUE_ERROR;
	}

	/* Calculate timeout */
	if (timeout != CSP_MAX_TIMEOUT) {
		if (get_deadline(&ts, timeout) != 0) {
			return PTHREAD_QUEUE_ERROR;
		}
		pts = &ts;
	} else {
		pts = NULL;
	}

	/* Get queue lock */
	pthread_mutex_lock(&(queue->mutex));

	ret = wait_item_available(queue, pts);
	if (ret == PTHREAD_QUEUE_OK) {
		/* Coby object to output buffer */
		memcpy(buf, (char *)queue->buffer + (queue->out * queue->item_size), queue->item_size);
		queue->items--;
		queue->out = (queue->out + 1) % queue->size;
	}

	pthread_mutex_unlock(&(queue->mutex));

	if (ret == PTHREAD_QUEUE_OK) {
		/* Nofify blocked threads */
		pthread_cond_broadcast(&(queue->cond_full));
	}

	return ret;
}